

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O3

void test_median_patch(GlobalArray *g_a,int *alo,int *ahi,GlobalArray *g_b,int *blo,int *bhi,
                      GlobalArray *g_c,int *clo,int *chi,GlobalArray *g_m,int *mlo,int *mhi)

{
  double dVar1;
  int *blo_00;
  int *lo;
  int *hi;
  GlobalArray *pGVar2;
  uint *this;
  DoubleComplex *val;
  GlobalArray *this_00;
  double *val_00;
  DoubleComplex *val_01;
  undefined8 *value;
  GlobalArray *this_01;
  char *message;
  double *pdVar3;
  undefined8 *value_00;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iStackY_3a8;
  int iStackY_3a4;
  undefined8 *puStackY_3a0;
  undefined8 *puStackY_398;
  undefined8 *puStackY_390;
  undefined4 uStackY_388;
  undefined4 uStackY_384;
  undefined4 uStackY_380;
  undefined4 uStackY_37c;
  undefined4 uStackY_378;
  undefined4 uStackY_374;
  undefined4 uStackY_370;
  undefined4 uStackY_36c;
  undefined4 uStackY_368;
  undefined4 uStackY_364;
  float fStackY_360;
  float fStackY_35c;
  int iStackY_358;
  int iStackY_354;
  undefined8 uStackY_350;
  undefined8 uStackY_348;
  undefined8 uStackY_340;
  undefined8 uStackY_338;
  undefined8 uStackY_330;
  undefined8 uStackY_328;
  undefined8 uStackY_318;
  undefined8 uStackY_310;
  undefined8 uStackY_308;
  undefined8 uStackY_300;
  undefined8 uStackY_2f8;
  undefined8 uStackY_2f0;
  undefined8 uStackY_2e8;
  undefined8 uStackY_2e0;
  undefined8 uStackY_2d8;
  undefined8 uStackY_2d0;
  double dStackY_2c8;
  double dStackY_2c0;
  double dStackY_2b8;
  double dStackY_2b0;
  int iStackY_2a4;
  double adStackY_2a0 [2];
  double dStackY_290;
  double dStackY_288;
  undefined8 uStackY_280;
  undefined8 uStackY_278;
  undefined8 uStackY_270;
  undefined8 uStackY_268;
  int aiStackY_260 [8];
  int aiStackY_240 [8];
  undefined8 uStackY_220;
  int type;
  int local_1e4;
  double *local_1e0;
  double *local_1d8;
  DoubleComplex *local_1d0;
  DoubleComplex *local_1c8;
  float fval3;
  int ival3;
  float fval2;
  int ival2;
  float fval;
  int ival;
  float bf;
  float af;
  int bi;
  int ai;
  float fmax;
  float fmin;
  int imax;
  int imin;
  double local_188 [7];
  long lval3;
  double dval3;
  long lval2;
  double dval2;
  long lval;
  double dval;
  int *local_120;
  GlobalArray *local_118;
  int *local_110;
  int *local_108;
  double bd;
  double ad;
  long bl;
  long al;
  double dmax;
  double dmin;
  long lmax;
  long lmin;
  int ndim;
  DoubleComplex dcmax;
  DoubleComplex dcmin;
  DoubleComplex bdc;
  DoubleComplex adc;
  int dims [7];
  int index [7];
  
  ai = 1;
  bi = -1;
  al = 1;
  bl = -1;
  af = 1.0;
  bf = -1.0;
  ad = 1.0;
  bd = -1.0;
  adc.real = 1.0;
  adc.imag = 0.0;
  bdc.real = -1.0;
  bdc.imag = 0.0;
  ival = -2;
  dval = -2.0;
  fval = -2.0;
  lval = -2;
  ival2 = 6;
  dval2 = 6.0;
  fval2 = 6.0;
  lval2 = 6;
  ival3 = 4;
  dval3 = 4.0;
  fval3 = 4.0;
  lval3 = 4;
  local_118 = g_b;
  local_1e4 = GA_Nodeid();
  GA::GlobalArray::inquire(g_a,&type,&ndim,dims);
  local_120 = blo;
  local_110 = alo;
  local_108 = bhi;
  switch(type) {
  case 0x3e9:
    local_1d8 = (double *)&ival3;
    local_1e0 = (double *)&ival2;
    pdVar3 = (double *)&ival;
    local_1c8 = (DoubleComplex *)&bi;
    local_1d0 = (DoubleComplex *)&ai;
    break;
  case 0x3ea:
    local_1d8 = (double *)&lval3;
    local_1e0 = (double *)&lval2;
    pdVar3 = (double *)&lval;
    local_1c8 = (DoubleComplex *)&bl;
    local_1d0 = (DoubleComplex *)&al;
    break;
  case 0x3eb:
    local_1d8 = (double *)&fval3;
    local_1e0 = (double *)&fval2;
    pdVar3 = (double *)&fval;
    local_1c8 = (DoubleComplex *)&bf;
    local_1d0 = (DoubleComplex *)&af;
    break;
  case 0x3ec:
    local_1d8 = &dval3;
    local_1e0 = &dval2;
    pdVar3 = &dval;
    local_1c8 = (DoubleComplex *)&bd;
    local_1d0 = (DoubleComplex *)&ad;
    break;
  default:
    GA::GAServices::error((GAServices *)&GA::SERVICES,"test_median:wrong data type.",type);
  case 0x3ef:
    pdVar3 = local_188 + 4;
    local_1e0 = local_188 + 2;
    local_1d8 = local_188;
    local_1c8 = &bdc;
    local_1d0 = &adc;
  }
  local_188[5] = -0.0;
  local_188[4] = -2.0;
  local_188[3] = 0.0;
  local_188[2] = 6.0;
  local_188[1] = 0.0;
  local_188[0] = 4.0;
  if (local_1e4 == 0) {
    printf("Testing GA_Median_patch...");
  }
  GA::GlobalArray::zero(g_a);
  pGVar2 = local_118;
  GA::GlobalArray::zero(local_118);
  GA::GlobalArray::zero(g_c);
  GA::GlobalArray::zero(g_m);
  lo = local_110;
  GA::GlobalArray::fillPatch(g_a,local_110,ahi,pdVar3);
  hi = local_108;
  blo_00 = local_120;
  GA::GlobalArray::fillPatch(pGVar2,local_120,local_108,local_1e0);
  GA::GlobalArray::fillPatch(g_c,lo,hi,local_1d8);
  uStackY_220 = 0x1049ca;
  GA::GlobalArray::medianPatch(g_m,g_a,lo,ahi,pGVar2,blo_00,hi,g_c,clo,chi,mlo,mhi);
  pGVar2 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,g_a,"E");
  GA::GlobalArray::zero(pGVar2);
  uStackY_220 = 0x104a30;
  GA::GlobalArray::addPatch(pGVar2,local_1d0,g_c,clo,chi,local_1c8,g_m,mlo,mhi,lo,ahi);
  this_01 = (GlobalArray *)(ulong)(uint)type;
  this = &switchD_00104a54::switchdataD_001b41c8;
  switch(type) {
  case 0x3e9:
    val_01 = (DoubleComplex *)&imin;
    val = (DoubleComplex *)&imax;
    break;
  case 0x3ea:
    val_01 = (DoubleComplex *)&lmin;
    val = (DoubleComplex *)&lmax;
    break;
  case 0x3eb:
    val_01 = (DoubleComplex *)&fmin;
    val = (DoubleComplex *)&fmax;
    break;
  case 0x3ec:
    val_01 = (DoubleComplex *)&dmin;
    val = (DoubleComplex *)&dmax;
    break;
  default:
    pGVar2 = (GlobalArray *)0x1b4484;
    GA_Error("test_median:wrong data type.",type);
    uStackY_364 = 1;
    uStackY_368 = 0xffffffff;
    uStackY_2d0 = 1;
    uStackY_2d8 = 0xffffffffffffffff;
    uStackY_36c = 0x3f800000;
    uStackY_370 = 0xbf800000;
    uStackY_2e0 = 0x3ff0000000000000;
    uStackY_2e8 = 0xbff0000000000000;
    uStackY_270 = 0x3ff0000000000000;
    uStackY_268 = 0;
    uStackY_280 = 0xbff0000000000000;
    uStackY_278 = 0;
    uStackY_374 = 0xfffffffe;
    uStackY_2f0 = 0xc000000000000000;
    uStackY_378 = 0xc0000000;
    uStackY_2f8 = 0xfffffffffffffffe;
    uStackY_37c = 6;
    uStackY_300 = 0x4018000000000000;
    uStackY_380 = 0x40c00000;
    uStackY_308 = 6;
    uStackY_384 = 4;
    uStackY_310 = 0x4010000000000000;
    uStackY_388 = 0x40800000;
    uStackY_318 = 4;
    iStackY_3a4 = GA_Nodeid();
    GA::GlobalArray::inquire(pGVar2,&iStackY_3a8,&iStackY_2a4,aiStackY_260);
    switch(iStackY_3a8) {
    case 0x3e9:
      puStackY_3a0 = (undefined8 *)&uStackY_384;
      value = (undefined8 *)&uStackY_37c;
      value_00 = (undefined8 *)&uStackY_374;
      puStackY_390 = (undefined8 *)&uStackY_368;
      puStackY_398 = (undefined8 *)&uStackY_364;
      break;
    case 0x3ea:
      puStackY_3a0 = &uStackY_318;
      value = &uStackY_308;
      value_00 = &uStackY_2f8;
      puStackY_390 = &uStackY_2d8;
      puStackY_398 = &uStackY_2d0;
      break;
    case 0x3eb:
      puStackY_3a0 = (undefined8 *)&uStackY_388;
      value = (undefined8 *)&uStackY_380;
      value_00 = (undefined8 *)&uStackY_378;
      puStackY_390 = (undefined8 *)&uStackY_370;
      puStackY_398 = (undefined8 *)&uStackY_36c;
      break;
    case 0x3ec:
      puStackY_3a0 = &uStackY_310;
      value = &uStackY_300;
      value_00 = &uStackY_2f0;
      puStackY_390 = &uStackY_2e8;
      puStackY_398 = &uStackY_2e0;
      break;
    default:
      GA::GAServices::error((GAServices *)&GA::SERVICES,"test_median:wrong data type.",iStackY_3a8);
    case 0x3ef:
      value_00 = &uStackY_330;
      value = &uStackY_340;
      puStackY_3a0 = &uStackY_350;
      puStackY_390 = &uStackY_280;
      puStackY_398 = &uStackY_270;
    }
    uStackY_328 = 0x8000000000000000;
    uStackY_330 = 0xc000000000000000;
    uStackY_338 = 0;
    uStackY_340 = 0x4018000000000000;
    uStackY_348 = 0;
    uStackY_350 = 0x4010000000000000;
    if (iStackY_3a4 == 0) {
      printf("Testing GA_Median...");
    }
    GA::GlobalArray::zero(pGVar2);
    GA::GlobalArray::zero(this_01);
    GA::GlobalArray::zero(this_00);
    GA::GlobalArray::zero((GlobalArray *)this);
    GA::GlobalArray::fill(pGVar2,value_00);
    GA::GlobalArray::fill(this_01,value);
    GA::GlobalArray::fill(this_00,puStackY_3a0);
    GA::GlobalArray::median((GlobalArray *)this,pGVar2,this_01,this_00);
    pGVar2 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,pGVar2,"E");
    GA::GlobalArray::add(pGVar2,puStackY_398,this_00,puStackY_390,(GlobalArray *)this);
    switch(iStackY_3a8) {
    case 0x3e9:
      pdVar3 = (double *)&iStackY_354;
      val_00 = (double *)&iStackY_358;
      break;
    case 0x3ea:
      pdVar3 = &dStackY_2b0;
      val_00 = &dStackY_2b8;
      break;
    case 0x3eb:
      pdVar3 = (double *)&fStackY_35c;
      val_00 = (double *)&fStackY_360;
      break;
    case 0x3ec:
      pdVar3 = &dStackY_2c0;
      val_00 = &dStackY_2c8;
      break;
    default:
      test_median();
    case 0x3ef:
      pdVar3 = &dStackY_290;
      val_00 = adStackY_2a0;
    }
    GA::GlobalArray::selectElem(pGVar2,"max",val_00,aiStackY_240);
    GA::GlobalArray::selectElem(pGVar2,"min",pdVar3,aiStackY_240);
    switch(iStackY_3a8) {
    case 0x3e9:
      if (iStackY_3a4 != 0) {
        return;
      }
      if (iStackY_354 == 0 && iStackY_358 == 0) goto LAB_00105447;
      break;
    case 0x3ea:
      if (iStackY_3a4 != 0) {
        return;
      }
      if (dStackY_2b0 == 0.0 && dStackY_2b8 == 0.0) goto LAB_00105447;
      break;
    case 0x3eb:
      if (iStackY_3a4 != 0) {
        return;
      }
      if (((fStackY_35c == 0.0) && (fStackY_360 == 0.0)) &&
         ((!NAN(fStackY_360) &&
          (fStackY_360 = fStackY_360 - fStackY_35c, uVar4 = -(uint)(fStackY_360 < -fStackY_360),
          (float)(~uVar4 & (uint)fStackY_360 | (uint)-fStackY_360 & uVar4) < 1e-05))))
      goto LAB_00105447;
      break;
    case 0x3ec:
      if (iStackY_3a4 != 0) {
        return;
      }
      uVar9 = SUB84(dStackY_2c0,0);
      uVar10 = (undefined4)((ulong)dStackY_2c0 >> 0x20);
      if ((dStackY_2c0 == 0.0) && (!NAN(dStackY_2c0))) {
        uVar7 = SUB84(dStackY_2c8,0);
        uVar8 = (undefined4)((ulong)dStackY_2c8 >> 0x20);
LAB_00105410:
        if ((((double)CONCAT44(uVar8,uVar7) == 0.0) && (!NAN((double)CONCAT44(uVar8,uVar7)))) &&
           (dVar1 = (double)CONCAT44(uVar8,uVar7) - (double)CONCAT44(uVar10,uVar9),
           uVar5 = -(ulong)(dVar1 < -dVar1),
           (double)(~uVar5 & (ulong)dVar1 | (ulong)-dVar1 & uVar5) < 1e-05)) {
LAB_00105447:
          puts("ok.");
          return;
        }
      }
      break;
    default:
      message = "test_median:wrong data type.";
      goto LAB_00105473;
    case 0x3ef:
      if (iStackY_3a4 != 0) {
        return;
      }
      if ((((dStackY_290 == 0.0) && (!NAN(dStackY_290))) && (adStackY_2a0[0] == 0.0)) &&
         ((!NAN(adStackY_2a0[0]) &&
          (adStackY_2a0[0] = adStackY_2a0[0] - dStackY_290,
          uVar5 = -(ulong)(adStackY_2a0[0] < -adStackY_2a0[0]),
          (double)(~uVar5 & (ulong)adStackY_2a0[0] | (ulong)-adStackY_2a0[0] & uVar5) < 1e-05)))) {
        uVar9 = SUB84(dStackY_288,0);
        uVar10 = (undefined4)((ulong)dStackY_288 >> 0x20);
        if ((dStackY_288 == 0.0) && (!NAN(dStackY_288))) {
          uVar7 = SUB84(adStackY_2a0[1],0);
          uVar8 = (undefined4)((ulong)adStackY_2a0[1] >> 0x20);
          goto LAB_00105410;
        }
      }
    }
    puts("not ok.");
    message = "test_median:mismatched.";
LAB_00105473:
    GA::GAServices::error((GAServices *)&GA::SERVICES,message,iStackY_3a8);
  case 0x3ef:
    val_01 = &dcmin;
    val = &dcmax;
  }
  GA::GlobalArray::selectElem(pGVar2,"max",val,index);
  GA::GlobalArray::selectElem(pGVar2,"min",val_01,index);
  switch(type) {
  case 0x3e9:
    if (local_1e4 != 0) {
      return;
    }
    if (imin != 0 || imax != 0) goto LAB_00104cc5;
    goto LAB_00104cb7;
  case 0x3ea:
    if (local_1e4 != 0) {
      return;
    }
    if (lmin == 0 && lmax == 0) goto LAB_00104cb7;
    goto LAB_00104cc5;
  case 0x3eb:
    if (local_1e4 != 0) {
      return;
    }
    if (((fmin == 0.0) && (fmax == 0.0)) &&
       ((!NAN(fmax) &&
        (fVar6 = fmax - fmin, uVar4 = -(uint)(fVar6 < -fVar6),
        (float)(~uVar4 & (uint)fVar6 | (uint)-fVar6 & uVar4) < 1e-05)))) goto LAB_00104cb7;
    goto LAB_00104cc5;
  case 0x3ec:
    if (local_1e4 != 0) {
      return;
    }
    uVar9 = SUB84(dmin,0);
    uVar10 = (undefined4)((ulong)dmin >> 0x20);
    if ((dmin != 0.0) || (NAN(dmin))) goto LAB_00104cc5;
    uVar7 = SUB84(dmax,0);
    uVar8 = (undefined4)((ulong)dmax >> 0x20);
    break;
  default:
    GA::GAServices::error((GAServices *)&GA::SERVICES,"test_median:wrong data type.",type);
  case 0x3ef:
    if (local_1e4 != 0) {
      return;
    }
    if (((dcmin.real != 0.0) || (NAN(dcmin.real))) ||
       ((dcmax.real != 0.0 ||
        ((NAN(dcmax.real) ||
         (dVar1 = dcmax.real - dcmin.real, uVar5 = -(ulong)(dVar1 < -dVar1),
         1e-05 <= (double)(~uVar5 & (ulong)dVar1 | (ulong)-dVar1 & uVar5))))))) goto LAB_00104cc5;
    uVar9 = SUB84(dcmin.imag,0);
    uVar10 = (undefined4)((ulong)dcmin.imag >> 0x20);
    if ((dcmin.imag != 0.0) || (NAN(dcmin.imag))) goto LAB_00104cc5;
    uVar7 = SUB84(dcmax.imag,0);
    uVar8 = (undefined4)((ulong)dcmax.imag >> 0x20);
  }
  if ((((double)CONCAT44(uVar8,uVar7) == 0.0) && (!NAN((double)CONCAT44(uVar8,uVar7)))) &&
     (dVar1 = (double)CONCAT44(uVar8,uVar7) - (double)CONCAT44(uVar10,uVar9),
     uVar5 = -(ulong)(dVar1 < -dVar1),
     (double)(~uVar5 & (ulong)dVar1 | (ulong)-dVar1 & uVar5) < 1e-05)) {
LAB_00104cb7:
    puts("ok.");
    return;
  }
LAB_00104cc5:
  puts("not ok.");
  GA_Error("test_median:mismatched.",type);
  return;
}

Assistant:

void 
test_median_patch (GA::GlobalArray * g_a, int *alo, int *ahi, 
		   GA::GlobalArray * g_b, int *blo, int *bhi,
		   GA::GlobalArray * g_c, int *clo, int *chi, 
		   GA::GlobalArray * g_m, int *mlo, int *mhi) {

  GA::GlobalArray * g_e;
  int index[MAXDIM];
  void *min, *max;
  int imin, imax;
  float fmin, fmax;
  long lmin, lmax;
  double dmin, dmax;
  DoubleComplex dcmin, dcmax;


  void *alpha, *beta;
  int ai = 1, bi = -1;
  long al = 1, bl = -1;
  float af = 1.0, bf = -1.0;
  double ad = 1.0, bd = -1.0;
  DoubleComplex adc = { 1.0, 0.0 };
  DoubleComplex bdc = {-1.0, 0.0 };

  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  void *val2;
  int ival2 = 6;
  double dval2 = 6.0;
  float fval2 = 6.0;
  long lval2 = 6;
  DoubleComplex dcval2;

  void *val3;
  int ival3 = 4;
  double dval3 = 4.0;
  float fval3 = 4.0;
  long lval3 = 4;
  DoubleComplex dcval3;

  int me = GA_Nodeid ();
  int type, ndim, dims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);


  switch (type)
    {
    case C_INT:
      alpha = (void *)&ai;
      beta =(void *) &bi;
      break;
    case C_DCPL:
      alpha =(void *) &adc;
      beta = (void *)&bdc;
      break;

    case C_DBL:
      alpha = (void *)&ad;
      beta = (void *)&bd;
      break;
    case C_FLOAT:
      alpha = (void *)&af;
      beta = (void *)&bf;
      break;
    case C_LONG:
      alpha = (void *)&al;
      beta = (void *)&bl;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }

  dcval.real = -2.0;
  dcval.imag = -0.0;

  dcval2.real = 6.0;
  dcval2.imag = 0.0;


  dcval3.real = 4.0;
  dcval3.imag = 0.0;


  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      val2 = (void *)&ival2;
      val3 = (void *)&ival3;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      val2 = (void *)&dcval2;
      val3 = (void *)&dcval3;
      break;
    case C_DBL:
      val = (void *)&dval;
      val2 = (void *)&dval2;
      val3 = (void *)&dval3;
      break;
    case C_FLOAT:
      val = (void *)&fval;
      val2 = (void *)&fval2;
      val3 = (void *)&fval3;
      break;
    case C_LONG:
      val = (void *)&lval;
      val2 = (void *)&lval2;
      val3 = (void *)&lval3;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:test_median:wrong data type.", 
			  type);
    }

  if (me == 0)
    printf ("Testing GA_Median_patch...");

  g_a->zero ();
  g_b->zero ();
  g_c->zero ();
  g_m->zero ();

  g_a->fillPatch (alo, ahi, val);
  g_b->fillPatch (blo, bhi, val2);
  g_c->fillPatch (alo, bhi, val3);

  g_m->medianPatch (g_a, alo, ahi, g_b, blo, bhi, g_c, clo, chi, mlo, mhi);

  /*
    The result array should        be g_c due to the value I chose: 
    val3 is the median of the three values val, val2, and val3
  */

  /* g_e = g_c - g_m */
  g_e = GA::SERVICES.createGA(g_a, (char *)"E");
  g_e->zero ();
  g_e->addPatch (alpha, g_c, clo, chi, beta, g_m, mlo, mhi, alo, ahi);

  switch (type)
    {
    case C_INT:
      max = (void *)&imax;
      min = (void *)&imin;
      break;
    case C_DCPL:
      max = (void *)&dcmax;
      min = (void *)&dcmin;
      break;
    case C_DBL:
      max = (void *)&dmax;
      min = (void *)&dmin;
      break;
    case C_FLOAT:
      max = (void *)&fmax;
      min = (void *)&fmin;
      break;
    case C_LONG:
      max = (void *)&lmax;
      min = (void *)&lmin;
      break;
    default:
      GA_Error ((char *)"test_median:wrong data type.", type);
    }

  g_e->selectElem ((char *)"max", max, index);
  g_e->selectElem ((char *)"min", min, index);


  switch (type)
    {
      double r, m;
    case C_INT:
      if (me == 0)
	{
	  if (MISMATCHED (imax, imin) || (imax != 0) || (imin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DCPL:
      r = dcmax.real - dcmin.real;
      m = dcmax.imag - dcmin.imag;
      if (me == 0)
	{
	  if (MISMATCHED (dcmax.real, dcmin.real) || (dcmax.real != 0.0)
	      || (dcmin.real != 0.0) || MISMATCHED (dcmax.imag, dcmin.imag)
	      || (dcmax.imag != 0.0) || (dcmin.imag != 0.0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DBL:
      if (me == 0)
	{
	  if (MISMATCHED (dmax, dmin) || (dmax != 0) || (dmin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_FLOAT:
      if (me == 0)
	{
	  if (MISMATCHED (fmax, fmin) || (fmax != 0) || (fmin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_LONG:
      if (me == 0)
	{
	  if (MISMATCHED (lmax, lmin) || (lmax != 0) || (lmin != 0)) {
	    printf ("not ok.\n");
        GA_Error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }


}